

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
processOnLeftSideBodyFixedAvgVelocityJacobian
          (KinDynComputationsPrivateAttributes *this,MatrixView<double> *jac)

{
  Transform *pTVar1;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>_>
  *in_RDI;
  Matrix6x6 newOutputFrame_X_oldOutputFrame_;
  Transform *world_X_base;
  Transform newOutputFrame_X_oldOutputFrame;
  DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>_>
  *in_stack_fffffffffffffd38;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>
  *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd58;
  MatrixView<double> *in_stack_fffffffffffffd88;
  Position local_f0 [24];
  Transform local_d8 [96];
  undefined8 local_78;
  Transform local_70 [112];
  
  iDynTree::Transform::Transform(local_70);
  if (*(int *)(in_RDI + 4) != 1) {
    if (*(int *)(in_RDI + 4) == 2) {
      local_78 = iDynTree::FreeFloatingPos::worldBasePos();
      in_stack_fffffffffffffd40 =
           (Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *)
           iDynTree::Transform::getRotation();
      iDynTree::Position::Zero();
      iDynTree::Transform::Transform(local_d8,(Rotation *)in_stack_fffffffffffffd40,local_f0);
      iDynTree::Transform::operator=(local_70,local_d8);
    }
    else {
      pTVar1 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::operator=(local_70,pTVar1);
    }
    iDynTree::Transform::asAdjointTransform();
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffd58);
    toEigen(in_stack_fffffffffffffd88);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::operator*
              (in_stack_fffffffffffffd58,in_RDI);
    toEigen(in_stack_fffffffffffffd88);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  return;
}

Assistant:

void KinDynComputations::KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian(
      MatrixView<double> jac)
{
    assert(jac.rows() == 6);

    Transform newOutputFrame_X_oldOutputFrame;
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return;
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        Transform & world_X_base = m_pos.worldBasePos();
        newOutputFrame_X_oldOutputFrame = Transform(world_X_base.getRotation(),Position::Zero());
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        newOutputFrame_X_oldOutputFrame = m_pos.worldBasePos();
    }

    Matrix6x6 newOutputFrame_X_oldOutputFrame_ = newOutputFrame_X_oldOutputFrame.asAdjointTransform();

    toEigen(jac) = toEigen(newOutputFrame_X_oldOutputFrame_)*toEigen(jac);
}